

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::noteLabelName(FunctionValidator *this,Name name)

{
  Name curr;
  bool bVar1;
  type_conflict *ptVar2;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar3;
  type_conflict *inserted;
  type *_;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> local_30;
  FunctionValidator *local_20;
  FunctionValidator *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  local_20 = this;
  bVar1 = IString::is((IString *)&this_local);
  if (bVar1) {
    pVar3 = std::
            unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
            ::insert(&this->labelNames,(value_type *)&this_local);
    local_30.first = pVar3.first.super__Node_iterator_base<wasm::Name,_true>._M_cur;
    local_30.second = pVar3.second;
    std::get<0ul,std::__detail::_Node_iterator<wasm::Name,true,true>,bool>(&local_30);
    ptVar2 = std::get<1ul,std::__detail::_Node_iterator<wasm::Name,true,true>,bool>(&local_30);
    curr.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    curr.super_IString.str._M_len = (size_t)this_local;
    shouldBeTrue<wasm::Name>
              (this,(bool)(*ptVar2 & 1),curr,
               "names in Binaryen IR must be unique - IR generators must ensure that");
  }
  return;
}

Assistant:

void FunctionValidator::noteLabelName(Name name) {
  if (!name.is()) {
    return;
  }
  auto [_, inserted] = labelNames.insert(name);
  shouldBeTrue(
    inserted,
    name,
    "names in Binaryen IR must be unique - IR generators must ensure that");
}